

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Segment::DoneParsing(Segment *this)

{
  int iVar1;
  undefined8 *in_RDI;
  longlong stop;
  int status;
  longlong avail;
  longlong total;
  undefined1 local_20 [8];
  long local_18 [2];
  bool local_1;
  
  if ((long)in_RDI[3] < 0) {
    iVar1 = (**(code **)(*(long *)*in_RDI + 8))((long *)*in_RDI,local_18,local_20);
    if (iVar1 < 0) {
      local_1 = true;
    }
    else if (local_18[0] < 0) {
      local_1 = false;
    }
    else {
      local_1 = local_18[0] <= (long)in_RDI[0xd];
    }
  }
  else {
    local_1 = (long)(in_RDI[2] + in_RDI[3]) <= (long)in_RDI[0xd];
  }
  return local_1;
}

Assistant:

bool Segment::DoneParsing() const {
  if (m_size < 0) {
    long long total, avail;

    const int status = m_pReader->Length(&total, &avail);

    if (status < 0)  // error
      return true;  // must assume done

    if (total < 0)
      return false;  // assume live stream

    return (m_pos >= total);
  }

  const long long stop = m_start + m_size;

  return (m_pos >= stop);
}